

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

try_get_result_type * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_get
          (try_get_result_type *__return_storage_ptr__,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  optimistic_lock *poVar1;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> aVar3;
  undefined1 this_00 [8];
  art_key_type aVar4;
  bool bVar5;
  node_type type;
  byte bVar6;
  value_type key_byte;
  uint uVar7;
  atomic<long> *paVar8;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_01;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_02;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_03;
  version_type other;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aVar9;
  find_result fVar10;
  basic_node_ptr<unodb::detail::olc_node_header> child;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *child_in_parent;
  uint shared_key_prefix_length;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *key_prefix;
  olc_inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  undefined1 local_488 [8];
  value_view val_view;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  undefined1 auStack_460 [7];
  node_type node_type;
  read_critical_section node_critical_section;
  art_key_type remaining_key;
  olc_node_ptr node;
  undefined1 local_438 [8];
  read_critical_section parent_critical_section;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  art_key_type k_local;
  bool result_15;
  bool result_12;
  bool result_9;
  bool result_6;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_7;
  bool result_10;
  bool result_13;
  bool result_16;
  bool result_17;
  version_type local_2a8;
  version_tag_type local_2a0;
  byte local_291;
  __atomic_base<unsigned_long> _Stack_290;
  bool result_14;
  version_type local_288;
  version_tag_type local_280;
  byte local_271;
  __atomic_base<unsigned_long> _Stack_270;
  bool result_11;
  version_type local_268;
  version_tag_type local_260;
  byte local_251;
  optimistic_lock *poStack_250;
  bool result_8;
  version_type local_248;
  version_tag_type local_240;
  byte local_231;
  optimistic_lock *poStack_230;
  bool result_5;
  version_type local_228;
  version_tag_type local_220;
  byte local_211;
  bool result_2;
  version_type local_208;
  long local_200;
  __int_type_conflict old_value_5;
  long local_1f0;
  __int_type_conflict old_value_4;
  long local_1e0;
  __int_type_conflict old_value_3;
  long local_1d0;
  __int_type_conflict old_value_2;
  long local_1c0;
  __int_type_conflict old_value_1;
  long local_1b0;
  __int_type_conflict old_value;
  long local_1a0;
  memory_order local_198;
  int local_194;
  memory_order __b;
  long local_188;
  memory_order local_180;
  int local_17c;
  memory_order __b_1;
  long local_170;
  memory_order local_168;
  int local_164;
  memory_order __b_2;
  long local_158;
  memory_order local_150;
  int local_14c;
  memory_order __b_3;
  long local_140;
  memory_order local_138;
  int local_134;
  memory_order __b_4;
  long local_128;
  memory_order local_120;
  int local_11c;
  memory_order __b_5;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  long local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  atomic<long> *local_d8;
  long local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  atomic<long> *local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  undefined8 local_90;
  atomic<long> *local_88;
  long local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  atomic<long> *local_60;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  parent_critical_section.version.version = (version_tag_type)this;
  optimistic_lock::try_read_lock((optimistic_lock *)local_438);
  bVar5 = optimistic_lock::read_critical_section::must_restart((read_critical_section *)local_438);
  if (bVar5) {
    spin_wait_loop_body();
    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
              (__return_storage_ptr__);
  }
  else {
    remaining_key.field_0 =
         (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
         in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                   (&this->root);
    bVar5 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                      ((basic_node_ptr<unodb::detail::olc_node_header> *)&remaining_key,
                       (nullptr_t)0x0);
    if (bVar5) {
      paVar8 = (atomic<long> *)((long)local_438 + 8);
      local_194 = 2;
      ___b = paVar8;
      local_198 = std::operator&(acquire,__memory_order_mask);
      if (local_194 - 1U < 2) {
        local_1a0 = (paVar8->super___atomic_base<long>)._M_i;
      }
      else if (local_194 == 5) {
        local_1a0 = (paVar8->super___atomic_base<long>)._M_i;
      }
      else {
        local_1a0 = (paVar8->super___atomic_base<long>)._M_i;
      }
      if (local_1a0 < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      local_110 = 2;
      local_220 = (version_tag_type)
                  optimistic_lock::atomic_version_type::load_relaxed
                            ((atomic_version_type *)local_438);
      local_211 = optimistic_lock::version_type::operator==(&local_208,(version_type)local_220);
      if (((local_211 ^ 0xff) & 1) != 0) {
        optimistic_lock::dec_read_lock_count((optimistic_lock *)local_438);
      }
      if ((local_211 & 1) != 0) {
        local_d8 = (atomic<long> *)((long)local_438 + 8);
        local_e0 = 1;
        local_e4 = 3;
        local_f0 = 1;
        LOCK();
        local_1b0 = (local_d8->super___atomic_base<long>)._M_i;
        (local_d8->super___atomic_base<long>)._M_i = (local_d8->super___atomic_base<long>)._M_i + -1
        ;
        UNLOCK();
        local_f8 = local_1b0;
        if (local_1b0 < 1) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      local_438 = (undefined1  [8])0x0;
      if (((local_211 & 1 ^ 0xff) & 1) == 0) {
        std::
        make_optional<std::optional<unodb::qsbr_ptr_span<std::byte_const>>,std::nullopt_t_const&>
                  (__return_storage_ptr__,(nullopt_t *)&std::nullopt);
      }
      else {
        spin_wait_loop_body();
        std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                  (__return_storage_ptr__);
      }
    }
    else {
      bVar5 = optimistic_lock::read_critical_section::check((read_critical_section *)local_438);
      aVar4.field_0 = k.field_0;
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        do {
          node_critical_section.version.version = (version_tag_type)aVar4.field_0;
          detail::node_ptr_lock((olc_node_ptr *)&remaining_key);
          optimistic_lock::try_read_lock((optimistic_lock *)auStack_460);
          bVar5 = optimistic_lock::read_critical_section::must_restart
                            ((read_critical_section *)auStack_460);
          this_00 = local_438;
          if (bVar5) {
            std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                      (__return_storage_ptr__);
            bVar5 = true;
          }
          else {
            poVar1 = (optimistic_lock *)local_438;
            paVar8 = (atomic<long> *)((long)local_438 + 8);
            local_17c = 2;
            poStack_230 = poVar1;
            ___b_1 = paVar8;
            local_180 = std::operator&(acquire,__memory_order_mask);
            if (local_17c - 1U < 2) {
              local_188 = (paVar8->super___atomic_base<long>)._M_i;
            }
            else if (local_17c == 5) {
              local_188 = (paVar8->super___atomic_base<long>)._M_i;
            }
            else {
              local_188 = (paVar8->super___atomic_base<long>)._M_i;
            }
            if (local_188 < 1) {
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            local_10c = 2;
            local_240 = (version_tag_type)
                        optimistic_lock::atomic_version_type::load_relaxed
                                  ((atomic_version_type *)this_00);
            local_231 = optimistic_lock::version_type::operator==
                                  (&local_228,(version_type)local_240);
            if (((local_231 ^ 0xff) & 1) != 0) {
              optimistic_lock::dec_read_lock_count((optimistic_lock *)this_00);
            }
            if ((local_231 & 1) != 0) {
              local_b0 = (atomic<long> *)((long)this_00 + 8);
              local_b8 = 1;
              local_bc = 3;
              local_c8 = 1;
              LOCK();
              local_1c0 = (local_b0->super___atomic_base<long>)._M_i;
              (local_b0->super___atomic_base<long>)._M_i =
                   (local_b0->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              old_value_1 = (__int_type_conflict)poVar1;
              local_d0 = local_1c0;
              if (local_1c0 < 1) {
                __assert_fail("old_value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
              }
            }
            local_438 = (undefined1  [8])0x0;
            if (((local_231 & 1 ^ 0xff) & 1) == 0) {
              type = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                               ((basic_node_ptr<unodb::detail::olc_node_header> *)&remaining_key);
              if (type == LEAF) {
                this_01 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
                          ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                                    ((basic_node_ptr<unodb::detail::olc_node_header> *)
                                     &remaining_key);
                val_view._M_extent._M_extent_value = (size_t)k.field_0;
                bVar5 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                                  (this_01,(art_key_type)k.field_0);
                aVar3.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_auStack_460;
                if (bVar5) {
                  _local_488 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::
                               get_value_view(this_01);
                  _Var2._M_i = _auStack_460;
                  poVar1 = (optimistic_lock *)_auStack_460;
                  paVar8 = (atomic<long> *)(_auStack_460 + 8);
                  local_164 = 2;
                  poStack_250 = poVar1;
                  ___b_2 = paVar8;
                  local_168 = std::operator&(acquire,__memory_order_mask);
                  if (local_164 - 1U < 2) {
                    local_170 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  else if (local_164 == 5) {
                    local_170 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  else {
                    local_170 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  if (local_170 < 1) {
                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                  }
                  local_108 = 2;
                  local_260 = (version_tag_type)
                              optimistic_lock::atomic_version_type::load_relaxed
                                        ((atomic_version_type *)_Var2._M_i);
                  local_251 = optimistic_lock::version_type::operator==
                                        (&local_248,(version_type)local_260);
                  if (((local_251 ^ 0xff) & 1) != 0) {
                    optimistic_lock::dec_read_lock_count((optimistic_lock *)_Var2._M_i);
                  }
                  if ((local_251 & 1) != 0) {
                    local_88 = (atomic<long> *)(_Var2._M_i + 8);
                    local_90 = 1;
                    local_94 = 3;
                    local_a0 = 1;
                    LOCK();
                    local_1d0 = (local_88->super___atomic_base<long>)._M_i;
                    (local_88->super___atomic_base<long>)._M_i =
                         (local_88->super___atomic_base<long>)._M_i + -1;
                    UNLOCK();
                    old_value_2 = (__int_type_conflict)poVar1;
                    local_a8 = local_1d0;
                    if (local_1d0 < 1) {
                      __assert_fail("old_value > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x343,
                                    "void unodb::optimistic_lock::dec_read_lock_count() const");
                    }
                  }
                  _auStack_460 = 0;
                  if (((local_251 & 1 ^ 0xff) & 1) == 0) {
                    qsbr_ptr_span<const_std::byte>::qsbr_ptr_span
                              ((qsbr_ptr_span<const_std::byte> *)&inode,
                               (span<const_std::byte,_18446744073709551615UL> *)local_488);
                    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::
                    optional<unodb::qsbr_ptr_span<const_std::byte>,_true>
                              (__return_storage_ptr__,(qsbr_ptr_span<const_std::byte> *)&inode);
                    qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span
                              ((qsbr_ptr_span<const_std::byte> *)&inode);
                    bVar5 = true;
                  }
                  else {
                    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                              (__return_storage_ptr__);
                    bVar5 = true;
                  }
                }
                else {
                  _Var2._M_i = _auStack_460;
                  paVar8 = (atomic<long> *)(_auStack_460 + 8);
                  local_14c = 2;
                  _Stack_270._M_i = _Var2._M_i;
                  ___b_3 = paVar8;
                  local_150 = std::operator&(acquire,__memory_order_mask);
                  if (local_14c - 1U < 2) {
                    local_158 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  else if (local_14c == 5) {
                    local_158 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  else {
                    local_158 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  if (local_158 < 1) {
                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                  }
                  local_104 = 2;
                  local_280 = (version_tag_type)
                              optimistic_lock::atomic_version_type::load_relaxed
                                        ((atomic_version_type *)
                                         aVar3.super___atomic_base<unsigned_long>._M_i);
                  local_271 = optimistic_lock::version_type::operator==
                                        (&local_268,(version_type)local_280);
                  if (((local_271 ^ 0xff) & 1) != 0) {
                    optimistic_lock::dec_read_lock_count
                              ((optimistic_lock *)aVar3.super___atomic_base<unsigned_long>._M_i);
                  }
                  if ((local_271 & 1) != 0) {
                    local_60 = (atomic<long> *)
                               ((long)aVar3.super___atomic_base<unsigned_long>._M_i + 8);
                    local_68 = 1;
                    local_6c = 3;
                    local_78 = 1;
                    LOCK();
                    local_1e0 = (local_60->super___atomic_base<long>)._M_i;
                    (local_60->super___atomic_base<long>)._M_i =
                         (local_60->super___atomic_base<long>)._M_i + -1;
                    UNLOCK();
                    old_value_3 = _Var2._M_i;
                    local_80 = local_1e0;
                    if (local_1e0 < 1) {
                      __assert_fail("old_value > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x343,
                                    "void unodb::optimistic_lock::dec_read_lock_count() const");
                    }
                  }
                  _auStack_460 = 0;
                  if (((local_271 & 1 ^ 0xff) & 1) == 0) {
                    std::
                    make_optional<std::optional<unodb::qsbr_ptr_span<std::byte_const>>,std::nullopt_t_const&>
                              (__return_storage_ptr__,(nullopt_t *)&std::nullopt);
                    bVar5 = true;
                  }
                  else {
                    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                              (__return_storage_ptr__);
                    bVar5 = true;
                  }
                }
              }
              else {
                this_02 = &detail::basic_node_ptr<unodb::detail::olc_node_header>::
                           ptr<unodb::detail::olc_inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                                     ((basic_node_ptr<unodb::detail::olc_node_header> *)
                                      &remaining_key)->
                           super_olc_inode_base<unsigned_long,_std::span<const_std::byte>_>;
                this_03 = detail::
                          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                          ::get_key_prefix(this_02);
                bVar6 = detail::
                        key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                        ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                  *)&this_03->f);
                uVar7 = detail::
                        key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                        ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                             *)&this_03->f,
                                            (basic_art_key<unsigned_long>)
                                            node_critical_section.version.version);
                aVar3.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_auStack_460;
                if (uVar7 < bVar6) {
                  _Var2._M_i = _auStack_460;
                  paVar8 = (atomic<long> *)(_auStack_460 + 8);
                  local_134 = 2;
                  _Stack_290._M_i = _Var2._M_i;
                  ___b_4 = paVar8;
                  local_138 = std::operator&(acquire,__memory_order_mask);
                  if (local_134 - 1U < 2) {
                    local_140 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  else if (local_134 == 5) {
                    local_140 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  else {
                    local_140 = (paVar8->super___atomic_base<long>)._M_i;
                  }
                  if (local_140 < 1) {
                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                  }
                  local_100 = 2;
                  local_2a0 = (version_tag_type)
                              optimistic_lock::atomic_version_type::load_relaxed
                                        ((atomic_version_type *)
                                         aVar3.super___atomic_base<unsigned_long>._M_i);
                  local_291 = optimistic_lock::version_type::operator==
                                        (&local_288,(version_type)local_2a0);
                  if (((local_291 ^ 0xff) & 1) != 0) {
                    optimistic_lock::dec_read_lock_count
                              ((optimistic_lock *)aVar3.super___atomic_base<unsigned_long>._M_i);
                  }
                  if ((local_291 & 1) != 0) {
                    local_38 = (atomic<long> *)
                               ((long)aVar3.super___atomic_base<unsigned_long>._M_i + 8);
                    local_40 = 1;
                    local_44 = 3;
                    local_50 = 1;
                    LOCK();
                    local_1f0 = (local_38->super___atomic_base<long>)._M_i;
                    (local_38->super___atomic_base<long>)._M_i =
                         (local_38->super___atomic_base<long>)._M_i + -1;
                    UNLOCK();
                    old_value_4 = _Var2._M_i;
                    local_58 = local_1f0;
                    if (local_1f0 < 1) {
                      __assert_fail("old_value > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x343,
                                    "void unodb::optimistic_lock::dec_read_lock_count() const");
                    }
                  }
                  _auStack_460 = 0;
                  if (((local_291 & 1 ^ 0xff) & 1) == 0) {
                    std::
                    make_optional<std::optional<unodb::qsbr_ptr_span<std::byte_const>>,std::nullopt_t_const&>
                              (__return_storage_ptr__,(nullopt_t *)&std::nullopt);
                    bVar5 = true;
                  }
                  else {
                    std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                              (__return_storage_ptr__);
                    bVar5 = true;
                  }
                }
                else {
                  if (uVar7 != bVar6) {
                    __assert_fail("shared_key_prefix_length == key_prefix_length",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x6d4,
                                  "typename olc_db<Key, Value>::try_get_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_get(art_key_type) const [Key = unsigned long, Value = std::span<const std::byte>]"
                                 );
                  }
                  detail::basic_art_key<unsigned_long>::shift_right
                            ((basic_art_key<unsigned_long> *)&node_critical_section.version,
                             (ulong)bVar6);
                  key_byte = detail::basic_art_key<unsigned_long>::operator[]
                                       ((basic_art_key<unsigned_long> *)
                                        &node_critical_section.version,0);
                  fVar10 = detail::
                           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                           ::find_child(this_02,type,key_byte);
                  aVar3.super___atomic_base<unsigned_long>._M_i =
                       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_auStack_460;
                  if (fVar10.second ==
                      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                       *)0x0) {
                    _Var2._M_i = _auStack_460;
                    paVar8 = (atomic<long> *)(_auStack_460 + 8);
                    local_11c = 2;
                    ___b_5 = paVar8;
                    local_120 = std::operator&(acquire,__memory_order_mask);
                    if (local_11c - 1U < 2) {
                      local_128 = (paVar8->super___atomic_base<long>)._M_i;
                    }
                    else if (local_11c == 5) {
                      local_128 = (paVar8->super___atomic_base<long>)._M_i;
                    }
                    else {
                      local_128 = (paVar8->super___atomic_base<long>)._M_i;
                    }
                    if (local_128 < 1) {
                      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const")
                      ;
                    }
                    local_fc = 2;
                    other = optimistic_lock::atomic_version_type::load_relaxed
                                      ((atomic_version_type *)
                                       aVar3.super___atomic_base<unsigned_long>._M_i);
                    bVar5 = optimistic_lock::version_type::operator==(&local_2a8,other);
                    if (((bVar5 ^ 0xffU) & 1) != 0) {
                      optimistic_lock::dec_read_lock_count
                                ((optimistic_lock *)aVar3.super___atomic_base<unsigned_long>._M_i);
                    }
                    if (bVar5) {
                      local_10 = (atomic<long> *)
                                 ((long)aVar3.super___atomic_base<unsigned_long>._M_i + 8);
                      local_18 = 1;
                      local_1c = 3;
                      local_28 = 1;
                      LOCK();
                      local_200 = (local_10->super___atomic_base<long>)._M_i;
                      (local_10->super___atomic_base<long>)._M_i =
                           (local_10->super___atomic_base<long>)._M_i + -1;
                      UNLOCK();
                      old_value_5 = _Var2._M_i;
                      local_30 = local_200;
                      if (local_200 < 1) {
                        __assert_fail("old_value > 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                      ,0x343,
                                      "void unodb::optimistic_lock::dec_read_lock_count() const");
                      }
                    }
                    _auStack_460 = 0;
                    if (((bVar5 ^ 0xffU) & 1) == 0) {
                      std::
                      make_optional<std::optional<unodb::qsbr_ptr_span<std::byte_const>>,std::nullopt_t_const&>
                                (__return_storage_ptr__,(nullopt_t *)&std::nullopt);
                      bVar5 = true;
                    }
                    else {
                      std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::
                      optional(__return_storage_ptr__);
                      bVar5 = true;
                    }
                  }
                  else {
                    aVar9.key_bytes._M_elems =
                         (array<std::byte,_8UL>)
                         in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         ::load(fVar10.second);
                    optimistic_lock::read_critical_section::operator=
                              ((read_critical_section *)local_438,
                               (read_critical_section *)auStack_460);
                    remaining_key.field_0 =
                         (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                         (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                         aVar9.key_bytes._M_elems;
                    detail::basic_art_key<unsigned_long>::shift_right
                              ((basic_art_key<unsigned_long> *)&node_critical_section.version,1);
                    bVar5 = optimistic_lock::read_critical_section::check
                                      ((read_critical_section *)local_438);
                    if (((bVar5 ^ 0xffU) & 1) == 0) {
                      bVar5 = false;
                    }
                    else {
                      std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::
                      optional(__return_storage_ptr__);
                      bVar5 = true;
                    }
                  }
                }
              }
            }
            else {
              std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                        (__return_storage_ptr__);
              bVar5 = true;
            }
          }
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)auStack_460);
          aVar4.field_0 =
               (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
               node_critical_section.version;
        } while (!bVar5);
      }
      else {
        spin_wait_loop_body();
        std::optional<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::optional
                  (__return_storage_ptr__);
      }
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_438)
  ;
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::try_get_result_type olc_db<Key, Value>::try_get(
    art_key_type k) const noexcept {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  detail::olc_node_ptr node{root.load()};  // load root into [node].

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {  // special path if empty tree.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock())) {
      // LCOV_EXCL_START
      spin_wait_loop_body();
      return {};
      // LCOV_EXCL_STOP
    }
    // return an empty result (breaks out of caller's while(true) loop)
    return std::make_optional<get_result>(std::nullopt);
  }

  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto remaining_key{k};

  while (true) {
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.ptr<leaf_type*>()};
      if (leaf->matches(k)) {
        const auto val_view{leaf->get_value_view()};
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        return qsbr_ptr_span<const std::byte>{val_view};
      }
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    auto* const inode{node.ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_key_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_key_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    UNODB_DETAIL_ASSERT(shared_key_prefix_length == key_prefix_length);

    remaining_key.shift_right(key_prefix_length);

    const auto* const child_in_parent{
        inode->find_child(node_type, remaining_key[0]).second};

    if (child_in_parent == nullptr) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}